

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.h
# Opt level: O2

Params * __thiscall
adios2::core::Operator::GetParameters<unsigned_long>
          (Params *__return_storage_ptr__,Operator *this,char *buffer,unsigned_long *pos)

{
  _Rb_tree_header *p_Var1;
  byte *pbVar2;
  unsigned_long uVar3;
  byte bVar4;
  unsigned_long uVar5;
  mapped_type *pmVar6;
  char cVar7;
  ulong uVar8;
  bool bVar9;
  string value;
  string key;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  key_type local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar7 = buffer[*pos];
  *pos = *pos + 1;
  while( true ) {
    bVar9 = cVar7 == '\0';
    cVar7 = cVar7 + -1;
    if (bVar9) break;
    pbVar2 = (byte *)(buffer + *pos);
    uVar8 = (ulong)*pbVar2;
    *pos = *pos + 1;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pbVar2 + 1,pbVar2 + 1 + uVar8);
    uVar5 = *pos;
    uVar3 = uVar5 + uVar8;
    *pos = uVar3;
    pbVar2 = (byte *)(buffer + uVar3);
    bVar4 = *pbVar2;
    *pos = uVar5 + 1 + uVar8;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,pbVar2 + 1,pbVar2 + 1 + bVar4);
    *pos = *pos + (ulong)bVar4;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_50);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Params GetParameters(const char *buffer, U &pos)
    {
        Params ret;
        uint8_t params = GetParameter<uint8_t>(buffer, pos);
        for (uint8_t i = 0; i < params; ++i)
        {
            uint8_t size = GetParameter<uint8_t>(buffer, pos);
            std::string key = std::string(reinterpret_cast<const char *>(buffer + pos), size);
            pos += size;
            size = GetParameter<uint8_t>(buffer, pos);
            std::string value = std::string(reinterpret_cast<const char *>(buffer + pos), size);
            pos += size;
            ret[key] = value;
        }
        return ret;
    }